

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
emplace_value<int>(btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   *this,size_type i,allocator_type *alloc,int *args)

{
  byte bVar1;
  byte bVar2;
  field_type fVar3;
  bool bVar4;
  ulong uVar5;
  template_ElementType<2L> *ptVar6;
  template_ElementType<2L> *ptVar7;
  template_ElementType<1L> *ptVar8;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *c;
  long lVar9;
  long lVar10;
  template_ElementType<2L> *local_38;
  
  bVar1 = count(this);
  if (i <= (long)(ulong)bVar1) {
    bVar1 = count(this);
    if (i < (long)(ulong)bVar1) {
      bVar1 = count(this);
      bVar2 = count(this);
      local_38 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
      local_38 = local_38 + ((ulong)bVar2 - 1);
      btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
      ::
      value_init<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>::slot_type*>
                ((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                  *)this,(ulong)bVar1,alloc,&local_38);
      bVar1 = count(this);
      uVar5 = (ulong)bVar1;
      lVar9 = uVar5 << 0x20;
      lVar10 = lVar9 + -0x200000000;
      while( true ) {
        lVar9 = lVar9 + -0x100000000;
        uVar5 = uVar5 - 1;
        if ((long)uVar5 <= i) break;
        ptVar6 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
        ptVar7 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
        *(undefined4 *)((long)&ptVar7->value + (lVar9 >> 0x1e)) =
             *(undefined4 *)((long)&ptVar6->value + (lVar10 >> 0x1e));
        lVar10 = lVar10 + -0x100000000;
      }
      value_destroy(this,i,alloc);
    }
    value_init<int>(this,i,alloc,args);
    fVar3 = count(this);
    ptVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
             ::GetField<1l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                             *)this);
    ptVar8[2] = fVar3 + '\x01';
    bVar4 = leaf(this);
    if (!bVar4) {
      bVar1 = count(this);
      if (i + 1 < (long)(ulong)bVar1) {
        bVar1 = count(this);
        uVar5 = (ulong)bVar1;
        while (i + 1 < (long)uVar5) {
          c = child(this,(int)(uVar5 - 1));
          set_child(this,(int)uVar5,c);
          uVar5 = uVar5 - 1;
        }
        btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
        ::GetField<3l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                        *)this);
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x5d5,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>, Args = <int>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                         allocator_type *alloc,
                                         Args &&... args) {
  assert(i <= count());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < count()) {
    value_init(count(), alloc, slot(count() - 1));
    for (size_type j = count() - 1; j > i; --j)
      slot_type::move(alloc, slot(j - 1), slot(j));
    value_destroy(i, alloc);
  }
  value_init(i, alloc, std::forward<Args>(args)...);
  set_count(count() + 1);

  if (!leaf() && count() > i + 1) {
    for (int j = count(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}